

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Observables.hh
# Opt level: O0

double __thiscall SSM::TwoByteObservable::convert(TwoByteObservable *this,const_iterator input)

{
  ushort uVar1;
  reference pbVar2;
  undefined8 extraout_RDX;
  double extraout_XMM0_Qa;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_> local_40
  ;
  ushort local_32;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
  _Stack_30;
  uint16_t raw1;
  ushort local_22;
  TwoByteObservable *pTStack_20;
  uint16_t raw0;
  TwoByteObservable *this_local;
  const_iterator input_local;
  
  pTStack_20 = this;
  this_local = (TwoByteObservable *)input._M_current;
  _Stack_30 = __gnu_cxx::
              __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
              ::operator+((__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                           *)&this_local,0);
  pbVar2 = __gnu_cxx::
           __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
           ::operator*(&stack0xffffffffffffffd0);
  input_local._M_current._7_1_ = *pbVar2;
  local_22 = (ushort)input_local._M_current._7_1_;
  local_40 = __gnu_cxx::
             __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
             ::operator+((__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                          *)&this_local,1);
  pbVar2 = __gnu_cxx::
           __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
           ::operator*(&local_40);
  input_local._M_current._6_1_ = *pbVar2;
  local_32 = (ushort)input_local._M_current._6_1_;
  uVar1 = local_22 << 8 | local_32;
  (*(this->super_Observable)._vptr_Observable[6])(this,(ulong)uVar1,extraout_RDX,(ulong)uVar1);
  return extraout_XMM0_Qa;
}

Assistant:

double convert(Bytes::const_iterator input) const override
    {
      uint16_t raw0 = std::to_integer<uint16_t>(*(input+0));
      uint16_t raw1 = std::to_integer<uint16_t>(*(input+1));
      return convert((raw0 << 8) | raw1);
    }